

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2d.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  pair<const_int_*,_const_int_*> pVar2;
  Matrix<int,_3UL,_3UL> kernel;
  Matrix<int,_6UL,_6UL> matrix;
  Matrix<int,_4UL,_4UL> hourglasses;
  istream_iterator<int,_char,_std::char_traits<char>,_long> reader;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_18;
  
  Matrix<int,_6UL,_6UL>::Matrix(&matrix);
  Matrix<int,_3UL,_3UL>::Matrix(&kernel);
  *(undefined8 *)
   ((long)kernel.elements._M_t.
          super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>
          .super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl + 0x10) = 1;
  *(undefined8 *)
   ((long)kernel.elements._M_t.
          super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>
          .super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl + 0x18) = 0x100000001;
  *(undefined8 *)
   kernel.elements._M_t.
   super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>._M_t.
   super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>.
   super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl = 0x100000001;
  *(undefined8 *)
   ((long)kernel.elements._M_t.
          super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>
          .super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl + 8) = 1;
  *(undefined4 *)
   ((long)kernel.elements._M_t.
          super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>
          .super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl + 0x20) = 1;
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator
            (&reader,(istream_type *)&std::cin);
  local_18._M_stream = reader._M_stream;
  local_18._M_value = reader._M_value;
  local_18._M_ok = reader._M_ok;
  std::copy_n<std::istream_iterator<int,char,std::char_traits<char>,long>,int,int*>
            (&local_18,0x24,
             (int *)matrix.elements._M_t.
                    super___uniq_ptr_impl<std::array<int,_36UL>,_std::default_delete<std::array<int,_36UL>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::array<int,_36UL>_*,_std::default_delete<std::array<int,_36UL>_>_>
                    .super__Head_base<0UL,_std::array<int,_36UL>_*,_false>._M_head_impl);
  Matrix<int,6ul,6ul>::conv<3ul,3ul>
            ((Matrix<int,6ul,6ul> *)&hourglasses,(Matrix<int,_3UL,_3UL> *)&matrix);
  Matrix<int,_6UL,_6UL>::dump(&matrix,(ostream *)&std::cout);
  Matrix<int,_3UL,_3UL>::dump(&kernel,(ostream *)&std::cout);
  Matrix<int,_4UL,_4UL>::dump(&hourglasses,(ostream *)&std::cout);
  pVar2 = std::__minmax_element<int_const*,__gnu_cxx::__ops::_Iter_less_iter>
                    (hourglasses.elements._M_t.
                     super___uniq_ptr_impl<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>
                     .super__Head_base<0UL,_std::array<int,_16UL>_*,_false>._M_head_impl,
                     (long)hourglasses.elements._M_t.
                           super___uniq_ptr_impl<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>
                           .super__Head_base<0UL,_std::array<int,_16UL>_*,_false>._M_head_impl +
                     0x40);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pVar2.second);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::unique_ptr<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_>::~unique_ptr
            (&hourglasses.elements);
  std::unique_ptr<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>::~unique_ptr
            (&kernel.elements);
  std::unique_ptr<std::array<int,_36UL>,_std::default_delete<std::array<int,_36UL>_>_>::~unique_ptr
            (&matrix.elements);
  return 0;
}

Assistant:

int main() {
  Matrix<int, 6, 6> matrix{};
  Matrix<int, 3, 3> kernel{1, 1, 1, 0, 1, 0, 1, 1, 1};
  auto reader = std::istream_iterator<int>(std::cin);
  std::copy_n(reader, 36, matrix.begin());
  auto hourglasses = matrix.conv(kernel);
  #ifndef NDEBUG
  matrix.dump(std::cout);
  kernel.dump(std::cout);
  hourglasses.dump(std::cout);
  #endif
  const int max_hourglass_value = *std::minmax_element(hourglasses.cbegin(), hourglasses.cend()).second;
  std::cout << max_hourglass_value << std::endl;
  return 0;
}